

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

void __thiscall
entityx::ComponentHelper<Position>::copy_component_to
          (ComponentHelper<Position> *this,Entity source,Entity target)

{
  Position *component;
  ComponentHandle<Position,_entityx::EntityManager> local_38;
  Entity local_28;
  Entity local_18;
  
  local_28.id_ = target.id_.id_;
  local_28.manager_ = target.manager_;
  local_18.id_ = source.id_.id_;
  local_18.manager_ = source.manager_;
  local_38 = Entity::component<Position,void>(&local_18);
  component = ComponentHandle<Position,_entityx::EntityManager>::get(&local_38);
  Entity::assign_from_copy<Position>(&local_28,component);
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }